

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3PutVarint(char *p,sqlite_int64 v)

{
  char *pcVar1;
  undefined8 local_28;
  sqlite_uint64 vu;
  uchar *q;
  sqlite_int64 v_local;
  char *p_local;
  
  local_28 = v;
  pcVar1 = p;
  do {
    vu = (sqlite_uint64)pcVar1;
    *(byte *)vu = (byte)local_28 & 0x7f | 0x80;
    local_28 = local_28 >> 7;
    pcVar1 = (char *)(vu + 1);
  } while (local_28 != 0);
  *(byte *)vu = *(byte *)vu & 0x7f;
  return (int)(vu + 1) - (int)p;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3PutVarint(char *p, sqlite_int64 v){
  unsigned char *q = (unsigned char *) p;
  sqlite_uint64 vu = v;
  do{
    *q++ = (unsigned char) ((vu & 0x7f) | 0x80);
    vu >>= 7;
  }while( vu!=0 );
  q[-1] &= 0x7f;  /* turn off high bit in final byte */
  assert( q - (unsigned char *)p <= FTS3_VARINT_MAX );
  return (int) (q - (unsigned char *)p);
}